

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

char * netaddr_socket_to_string(netaddr_str *dst,netaddr_socket *src)

{
  sa_family_t sVar1;
  char *pcVar2;
  ushort uVar3;
  char *pcVar4;
  char scope_buf [16];
  netaddr_str buf;
  char acStack_78 [26];
  char local_5e [62];
  
  sVar1 = (src->v4).sin_family;
  if (sVar1 == 0) {
    strscpy(dst->buf,"-",0x3e);
  }
  else {
    if (sVar1 == 10) {
      if ((src->v6).sin6_scope_id != 0) {
        pcVar2 = inet_ntop(10,(src->v4).sin_zero,local_5e,0x3e);
        uVar3 = (src->v4).sin_port;
        pcVar4 = if_indextoname((src->v6).sin6_scope_id,acStack_78);
        snprintf(dst->buf,0x3e,"[%s]:%d%%%s",pcVar2,(ulong)(ushort)(uVar3 << 8 | uVar3 >> 8),pcVar4)
        ;
        return dst->buf;
      }
      pcVar2 = inet_ntop(10,(src->v4).sin_zero,local_5e,0x3e);
      uVar3 = (src->v4).sin_port << 8 | (src->v4).sin_port >> 8;
      pcVar4 = "[%s]:%d";
    }
    else {
      if (sVar1 != 2) {
        snprintf(dst->buf,0x3e,"\"Unknown socket type: %d\"");
        return dst->buf;
      }
      pcVar2 = inet_ntop(2,&(src->v4).sin_addr,local_5e,0x3e);
      uVar3 = (src->v4).sin_port << 8 | (src->v4).sin_port >> 8;
      pcVar4 = "%s:%d";
    }
    snprintf(dst->buf,0x3e,pcVar4,pcVar2,(ulong)uVar3);
  }
  return dst->buf;
}

Assistant:

const char *
netaddr_socket_to_string(struct netaddr_str *dst, const union netaddr_socket *src) {
  struct netaddr_str buf;
  static const char NONE[] = "-";

  if (src->std.sa_family == AF_INET) {
    snprintf(dst->buf, sizeof(*dst), "%s:%d", inet_ntop(AF_INET, &src->v4.sin_addr, buf.buf, sizeof(buf)),
      ntohs(src->v4.sin_port));
  }
  else if (src->std.sa_family == AF_INET6) {
    if (src->v6.sin6_scope_id) {
      char scope_buf[IF_NAMESIZE];

      snprintf(dst->buf, sizeof(*dst), "[%s]:%d%%%s", inet_ntop(AF_INET6, &src->v6.sin6_addr, buf.buf, sizeof(buf)),
        ntohs(src->v6.sin6_port), if_indextoname(src->v6.sin6_scope_id, scope_buf));
    }
    else {
      snprintf(dst->buf, sizeof(*dst), "[%s]:%d", inet_ntop(AF_INET6, &src->v6.sin6_addr, buf.buf, sizeof(buf)),
        ntohs(src->v6.sin6_port));
    }
  }
  else if (src->std.sa_family == 0) {
    strscpy(dst->buf, NONE, sizeof(*dst));
  }
  else {
    snprintf(dst->buf, sizeof(*dst), "\"Unknown socket type: %d\"", src->std.sa_family);
  }

  return dst->buf;
}